

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<wasm::Field> *
wasm::WATParser::storagetype<wasm::WATParser::ParseTypeDefsCtx>
          (Result<wasm::Field> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  undefined8 *puVar1;
  bool bVar2;
  string_view expected;
  string_view expected_00;
  undefined1 local_90 [8];
  Result<wasm::Type> type;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [8];
  Result<wasm::Type> _val;
  
  expected._M_str = "i8";
  expected._M_len = 2;
  bVar2 = Lexer::takeKeyword(&ctx->in,expected);
  if (bVar2) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
      super__Move_assign_alias<wasm::Field,_wasm::Err>.
      super__Copy_assign_alias<wasm::Field,_wasm::Err>.
      super__Move_ctor_alias<wasm::Field,_wasm::Err>.super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
      super__Variant_storage_alias<wasm::Field,_wasm::Err> = 2;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
             super__Move_assign_alias<wasm::Field,_wasm::Err>.
             super__Copy_assign_alias<wasm::Field,_wasm::Err>.
             super__Move_ctor_alias<wasm::Field,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
             super__Variant_storage_alias<wasm::Field,_wasm::Err> + 8) = 1;
  }
  else {
    expected_00._M_str = "i16";
    expected_00._M_len = 3;
    bVar2 = Lexer::takeKeyword(&ctx->in,expected_00);
    if (!bVar2) {
      valtype<wasm::WATParser::ParseTypeDefsCtx>((Result<wasm::Type> *)local_90,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_48,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_90);
      if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        type.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = &local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),local_48,
                   (long)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first.
                         _M_storage.id + (long)local_48);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
                         super__Move_assign_alias<wasm::Field,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Field,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
          super__Move_assign_alias<wasm::Field,_wasm::Err>.
          super__Copy_assign_alias<wasm::Field,_wasm::Err>.
          super__Move_ctor_alias<wasm::Field,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
          super__Variant_storage_alias<wasm::Field,_wasm::Err> = puVar1;
        if ((undefined8 *)
            type.val.super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ == &local_58) {
          *puVar1 = local_58;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
                   super__Move_assign_alias<wasm::Field,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Field,_wasm::Err> + 0x18) = uStack_50;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::Err> =
               type.val.super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
                   super__Move_assign_alias<wasm::Field,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Field,_wasm::Err> + 0x10) = local_58;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
                 super__Move_assign_alias<wasm::Field,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Field,_wasm::Err> + 8) = local_60;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
                 super__Move_assign_alias<wasm::Field,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Field,_wasm::Err> + 0x20) = '\x01';
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_48);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_48);
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
          super__Move_assign_alias<wasm::Field,_wasm::Err>.
          super__Copy_assign_alias<wasm::Field,_wasm::Err>.
          super__Move_ctor_alias<wasm::Field,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
          super__Variant_storage_alias<wasm::Field,_wasm::Err> = local_90;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
                 super__Move_assign_alias<wasm::Field,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Field,_wasm::Err> + 8) = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
                 super__Move_assign_alias<wasm::Field,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Field,_wasm::Err> + 0x20) = '\0';
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_90);
      return __return_storage_ptr__;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
      super__Move_assign_alias<wasm::Field,_wasm::Err>.
      super__Copy_assign_alias<wasm::Field,_wasm::Err>.
      super__Move_ctor_alias<wasm::Field,_wasm::Err>.super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
      super__Variant_storage_alias<wasm::Field,_wasm::Err> = 2;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
             super__Move_assign_alias<wasm::Field,_wasm::Err>.
             super__Copy_assign_alias<wasm::Field,_wasm::Err>.
             super__Move_ctor_alias<wasm::Field,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
             super__Variant_storage_alias<wasm::Field,_wasm::Err> + 8) = 2;
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::Err>.
           super__Move_assign_alias<wasm::Field,_wasm::Err>.
           super__Copy_assign_alias<wasm::Field,_wasm::Err>.
           super__Move_ctor_alias<wasm::Field,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
           super__Variant_storage_alias<wasm::Field,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::FieldT> storagetype(Ctx& ctx) {
  if (ctx.in.takeKeyword("i8"sv)) {
    return ctx.makeI8();
  }
  if (ctx.in.takeKeyword("i16"sv)) {
    return ctx.makeI16();
  }
  auto type = valtype(ctx);
  CHECK_ERR(type);
  return ctx.makeStorageType(*type);
}